

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Segment.cpp
# Opt level: O2

void __thiscall
pobr::imgProcessing::structs::Segment::updatePixels
          (Segment *this,Mat_<cv::Vec<int,_3>_> *segmentedImg,int *segmentID)

{
  uint64_t uVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  uint64_t uVar5;
  int x;
  ulong uVar6;
  ulong uVar7;
  Mat local_80 [96];
  
  cv::Mat_<cv::Vec<unsigned_char,_3>_>::Mat_
            ((Mat_<cv::Vec<unsigned_char,_3>_> *)local_80,((int)this->yMax - (int)this->yMin) + 1,
             ((int)this->xMax - (int)this->xMin) + 1);
  cv::Mat::operator=(&(this->pixels).super_Mat,local_80);
  cv::Mat::~Mat(local_80);
  for (uVar6 = 0; uVar6 < (this->xMax - this->xMin) + 1; uVar6 = uVar6 + 1) {
    lVar4 = uVar6 * 3;
    for (uVar7 = 0; uVar1 = this->yMin, uVar7 < (this->yMax - uVar1) + 1; uVar7 = uVar7 + 1) {
      uVar5 = this->xMin;
      lVar2 = **(long **)&segmentedImg->field_0x48;
      lVar3 = *(long *)&segmentedImg->field_0x10;
      *(undefined1 *)
       (**(long **)&(this->pixels).field_0x48 * uVar7 + *(long *)&(this->pixels).field_0x10 + 1 +
       lVar4) = 0;
      *(undefined1 *)
       (**(long **)&(this->pixels).field_0x48 * uVar7 + *(long *)&(this->pixels).field_0x10 + 2 +
       lVar4) = 0;
      *(char *)(**(long **)&(this->pixels).field_0x48 * uVar7 + *(long *)&(this->pixels).field_0x10
               + lVar4) =
           -(*(int *)((long)((int)uVar5 + (int)uVar6) * 0xc +
                     ((int)uVar1 + (int)uVar7) * lVar2 + lVar3) == *segmentID);
    }
  }
  return;
}

Assistant:

const void
Segment::updatePixels(const cv::Mat_<cv::Vec3i>& segmentedImg, const int& segmentID)
{
    this->pixels = cv::Mat_<cv::Vec3b>(
        (this->yMax - this->yMin + 1),
        (this->xMax - this->xMin + 1)
    );

    for (int x = 0; x < (this->xMax - this->xMin + 1); x++) {
        for (int y = 0; y < (this->yMax - this->yMin + 1); y++) {
            auto& thisSegmentID = segmentedImg(this->yMin + y, this->xMin + x)[0];

            this->pixels(y, x)[1] = consts::colors::black;
            this->pixels(y, x)[2] = consts::colors::black;

            if (thisSegmentID != segmentID) {
                this->pixels(y, x)[0] = consts::colors::black;
            } else {
                this->pixels(y, x)[0] = consts::colors::white;
            }
        }
    }
}